

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O2

PtexCachedReader * __thiscall
Ptex::v2_2::
PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>::pop
          (PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
           *this)

{
  int iVar1;
  PtexLruItem *pPVar2;
  PtexCachedReader *pPVar3;
  
  pPVar2 = PtexLruItem::pop(&this->_end);
  if (PtexLruList<Ptex::v2_2::PtexCachedReader,&Ptex::v2_2::PtexCachedReader::_activeFilesItem>::
      pop()::itemOffset == '\0') {
    iVar1 = __cxa_guard_acquire(&PtexLruList<Ptex::v2_2::PtexCachedReader,&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
                                 ::pop()::itemOffset);
    if (iVar1 != 0) {
      pop::itemOffset = 0x300;
      __cxa_guard_release(&PtexLruList<Ptex::v2_2::PtexCachedReader,&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
                           ::pop()::itemOffset);
    }
  }
  pPVar3 = (PtexCachedReader *)((long)pPVar2 - pop::itemOffset);
  if (pPVar2 == (PtexLruItem *)0x0) {
    pPVar3 = (PtexCachedReader *)0x0;
  }
  return pPVar3;
}

Assistant:

T* pop()
    {
        PtexLruItem* it = _end.pop();
        // "it" points to the intrusive item, a member within T
        // subtract off the pointer-to-member offset to get a pointer to the containing T object
        static const T* dummy = 0;
        static const std::ptrdiff_t itemOffset = (const char*)&(dummy->*item) - (const char*)dummy;
        return it ? (T*) ((char*)it - itemOffset) : 0;
    }